

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O0

bool __thiscall auto_array<short>::pop(auto_array<short> *this,short *elements,size_t length)

{
  short *in_RDX;
  long in_RSI;
  short *in_RDI;
  bool local_1;
  
  if (*(short **)(in_RDI + 8) < in_RDX) {
    local_1 = false;
  }
  else {
    if (in_RSI != 0) {
      PodCopy<short>(in_RDX,in_RDI,0x1150dc);
    }
    PodMove<short>(in_RDX,in_RDI,0x1150ff);
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) - (long)in_RDX;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool pop(T * elements, size_t length)
  {
    if (length > length_) {
      return false;
    }
    if (elements) {
      PodCopy(elements, data_, length);
    }
    PodMove(data_, data_ + length, length_ - length);

    length_ -= length;

    return true;
  }